

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Insert_Leaf(BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *C,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,Addr p)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  vector<char,_std::allocator<char>_> *__x_00;
  vector<Addr,_std::allocator<Addr>_> *__x_01;
  long lVar1;
  pointer pcVar2;
  pointer pAVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<char,_std::allocator<char>_> local_70;
  vector<Addr,_std::allocator<Addr>_> local_58;
  Addr local_40;
  Addr AStack_38;
  
  __x = &C->k;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__x);
  __x_00 = &C->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_70,__x_00);
  __x_01 = &C->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_58,__x_01);
  local_40 = C->parent;
  AStack_38 = C->self;
  Buffer::Lock(&blocks,AStack_38.BlockNum);
  if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  uVar5 = this->N;
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  else {
    uVar8 = 0;
    do {
      if ((__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar8] != '1') goto LAB_00133525;
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
    uVar8 = (ulong)uVar5;
LAB_00133525:
    if ((int)uVar5 < 1) {
      lVar6 = 0;
    }
    else {
      lVar7 = 0;
      lVar6 = 0;
      do {
        if (((__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar6] != '1') ||
           (iVar4 = std::__cxx11::string::compare
                              ((string *)
                               ((long)&(((__x->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar7)), -1 < iVar4)) break;
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x20;
      } while (lVar6 < this->N);
    }
    iVar4 = (int)uVar8;
    uVar5 = (uint)lVar6;
    if ((int)uVar5 < iVar4) {
      lVar7 = (long)iVar4 << 5;
      lVar6 = (long)iVar4;
      do {
        lVar1 = lVar6 + -1;
        pcVar2 = (__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar2[lVar6] = pcVar2[lVar6 + -1];
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&(((__x->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7)
                  );
        pAVar3 = (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar3[lVar6] = pAVar3[lVar6 + -1];
        lVar7 = lVar7 + -0x20;
        lVar6 = lVar1;
      } while ((int)uVar5 < lVar1);
    }
  }
  std::__cxx11::string::_M_assign
            ((string *)
             ((__x->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + uVar5));
  (__x_01->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data._M_start
  [uVar5] = p;
  (__x_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [uVar5] = '1';
  return;
}

Assistant:

void BpTree<K>::Insert_Leaf(IndexNode<K>& C, K k, Addr p) {
	this->LockNode(C);
	//�õ���Ӧ��ַ�����ã���C�޸ļ��ɶ�ԭ���޸�
	int pos, i, j;
	for (i = 0; i < N && C.v[i] == '1'; i++);							//��iλ���п�
	for (pos = 0; pos < N && C.v[pos] == '1' && C.k[pos] < k; pos++);	//pos���Ժ���Ҫ��Ǩ
	for (j = i; j > pos; j--) {
		C.v[j] = C.v[j - 1];
		C.k[j] = C.k[j - 1];
		C.p[j] = C.p[j - 1];
	}
	C.k[pos] = k;
	C.p[pos] = p;
	C.v[pos] = '1';
}